

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void cpptempl::parse_tree(token_vector *tokens,token_vector *tree,TokenType until)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  TokenType TVar3;
  token_ptr token;
  token_vector children;
  
  this = &token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  do {
    p_Var1 = &((tokens->
               super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var1 == &((tokens->
                    super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>) {
      return;
    }
    std::__shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>,p_Var1);
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    erase(tokens,(tokens->
                 super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
    iVar2 = (**(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_Token)();
    if (iVar2 == 4) {
      children.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parse_tree(tokens,&children,TOKEN_TYPE_ENDFOR);
      (*(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Token
        [2])(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&children)
      ;
LAB_00160a05:
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      ~vector(&children);
    }
    else {
      iVar2 = (**(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (iVar2 == 3) {
        children.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        children.
        super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        parse_tree(tokens,&children,TOKEN_TYPE_ENDIF);
        (*(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_Token[2])(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&children);
        goto LAB_00160a05;
      }
      TVar3 = (**(token.super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_Token)();
      if (TVar3 == until) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
        return;
      }
    }
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    push_back(tree,&token);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
  } while( true );
}

Assistant:

inline void parse_tree(token_vector &tokens, token_vector &tree, TokenType until)
    {
        while(! tokens.empty())
        {
            // 'pops' first item off list
            token_ptr token = tokens[0] ;
            tokens.erase(tokens.begin()) ;

            if (token->gettype() == TOKEN_TYPE_FOR)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDFOR) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == TOKEN_TYPE_IF)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDIF) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == until)
            {
                return ;
            }
            tree.push_back(token) ;
        }
    }